

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O2

void init_enum_type(module *m)

{
  handle hVar1;
  unique_function_record uVar2;
  class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *this;
  object local_58;
  class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> enum_;
  unique_function_record local_48;
  unique_function_record unique_rec;
  cpp_function local_38;
  cpp_function cf;
  
  pybind11::class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_>::class_<>
            ((class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> *)&local_58,
             (m->super_object).super_handle.m_ptr,"Enum");
  this = (class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)
         pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::
         def_readonly<kratos::Enum,std::__cxx11::string>
                   ((class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)&local_58,"name",0x40);
  hVar1.m_ptr = *(PyObject **)this;
  enum_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&unique_rec,hVar1,"__getitem__",(PyObject *)&_Py_NoneStruct);
  uVar2 = unique_rec;
  local_38.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_48);
  *(code **)((long)local_48._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_enum_type(pybind11::module_&)::$_0,std::shared_ptr<kratos::EnumConst>,kratos::Enum&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum_type(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::EnumConst>(*)(kratos::Enum&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_48._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__getitem__";
  *(byte *)((long)local_48._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_48._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  *(PyObject **)
   ((long)local_48._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70) =
       hVar1.m_ptr;
  *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
    *)((long)local_48._M_t.
             super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78)
       = uVar2._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  pybind11::cpp_function::initialize_generic
            (&local_38,&local_48,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_enum_type(pybind11::module_&)::$_0,std::shared_ptr<kratos::EnumConst>,kratos::Enum&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum_type(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::EnumConst>(*)(kratos::Enum&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_48);
  pybind11::object::~object((object *)&unique_rec);
  pybind11::object::~object((object *)&enum_);
  pybind11::detail::add_class_method((object *)this,"__getitem__",&local_38);
  pybind11::object::~object((object *)&local_38);
  hVar1.m_ptr = *(PyObject **)this;
  enum_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&unique_rec,hVar1,"__getattr__",(PyObject *)&_Py_NoneStruct);
  local_38.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_48);
  *(code **)((long)local_48._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_enum_type(pybind11::module_&)::$_1,std::shared_ptr<kratos::EnumConst>,kratos::Enum&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum_type(pybind11::module_&)::$_1&&,std::shared_ptr<kratos::EnumConst>(*)(kratos::Enum&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_48._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__getattr__";
  *(byte *)((long)local_48._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_48._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_48._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = hVar1.m_ptr;
  ((handle *)
  ((long)local_48._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = (PyObject *)
          unique_rec._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  pybind11::cpp_function::initialize_generic
            (&local_38,&local_48,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_enum_type(pybind11::module_&)::$_1,std::shared_ptr<kratos::EnumConst>,kratos::Enum&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum_type(pybind11::module_&)::$_1&&,std::shared_ptr<kratos::EnumConst>(*)(kratos::Enum&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_48);
  pybind11::object::~object((object *)&unique_rec);
  pybind11::object::~object((object *)&enum_);
  pybind11::detail::add_class_method((object *)this,"__getattr__",&local_38);
  pybind11::object::~object((object *)&local_38);
  pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::def_readwrite<kratos::Enum,bool>
            (this,"external",0x60);
  pybind11::object::~object(&local_58);
  return;
}

Assistant:

void init_enum_type(py::module &m) {
    using namespace kratos;
    auto enum_ = py::class_<Enum, std::shared_ptr<Enum>>(m, "Enum");
    enum_.def_readonly("name", &Enum::name)
        .def("__getitem__",
             [](Enum &enum_, const std::string &name) { return enum_.get_enum(name); })
        .def("__getattr__",
             [](Enum &enum_, const std::string &name) { return enum_.get_enum(name); })
        .def_readwrite("external", &Enum::external);
}